

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,VariableDeclaration *variable_declaration)

{
  Type *type;
  PrimitiveSimpleObject *this_00;
  ArrayType *type_00;
  size_t sVar1;
  Symbol local_a0;
  Symbol local_80;
  string local_60;
  string local_40;
  
  type = variable_declaration->type_;
  if ((type->type_name_)._M_dataplus._M_p[(type->type_name_)._M_string_length - 1] == ']') {
    this_00 = (PrimitiveSimpleObject *)operator_new(0x10);
    type_00 = (ArrayType *)__dynamic_cast(type,&Type::typeinfo,&ArrayType::typeinfo,0);
    PrimitiveArrayObject::PrimitiveArrayObject((PrimitiveArrayObject *)this_00,type_00);
  }
  else {
    this_00 = (PrimitiveSimpleObject *)operator_new(0x18);
    PrimitiveSimpleObject::PrimitiveSimpleObject(this_00,type);
  }
  sVar1 = FrameEmulator::AllocVariable(&this->frame_,&this_00->super_PrimitiveObject);
  std::__cxx11::string::string((string *)&local_40,(string *)&variable_declaration->variable_name_);
  Symbol::Symbol(&local_80,&local_40);
  FunctionTable::CreateVariable(&this->table_,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,(string *)&variable_declaration->variable_name_);
  Symbol::Symbol(&local_a0,&local_60);
  FunctionTable::Put(&this->table_,&local_a0,(int)sVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(
    VariableDeclaration* variable_declaration) {
  size_t index;

  if (variable_declaration->type_->type_name_.back() != ']') {
    index = frame_.AllocVariable(
        new PrimitiveSimpleObject(variable_declaration->type_));
  } else {
    index = frame_.AllocVariable(new PrimitiveArrayObject(
        dynamic_cast<ArrayType*>(variable_declaration->type_)));
  }

  table_.CreateVariable(Symbol(variable_declaration->variable_name_));
  table_.Put(Symbol(variable_declaration->variable_name_), index);
}